

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBlendTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::gles2::Functional::BlendCase::iterate(BlendCase *this)

{
  ostringstream *poVar1;
  TextureFormat TVar2;
  ReferenceQuadRenderer *pRVar3;
  RenderContext *context;
  TestLog *log;
  bool bVar4;
  deUint32 dVar5;
  GLenum GVar6;
  int iVar7;
  RenderTarget *pRVar8;
  char *pcVar9;
  size_t sVar10;
  int i;
  int iVar11;
  long lVar12;
  IterateResult IVar13;
  uint uVar14;
  uint y;
  qpTestResult testResult;
  void *pvVar15;
  pointer pBVar16;
  Surface referenceImg;
  Surface renderedImg;
  Vector<unsigned_int,_4> res;
  Vector<unsigned_int,_4> res_1;
  UVec4 compareThreshold;
  PixelBufferAccess nullAccess;
  FragmentOperationState referenceState;
  Random rnd;
  Surface local_338;
  Surface local_320;
  ConstPixelBufferAccess local_308;
  ConstPixelBufferAccess local_2d8;
  TextureFormat local_2a8;
  int iStack_2a0;
  int iStack_29c;
  uint local_28c;
  uint local_288 [4];
  UVec4 local_278;
  undefined1 local_260 [384];
  FragmentOperationState local_e0;
  deRandom local_40;
  
  dVar5 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  uVar14 = ((uint)this->m_curParamSetNdx >> 0x10 ^ this->m_curParamSetNdx ^ 0x3d) * 9;
  uVar14 = (uVar14 >> 4 ^ uVar14) * 0x27d4eb2d;
  deRandom_init(&local_40,uVar14 >> 0xf ^ dVar5 ^ uVar14);
  pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar7 = pRVar8->m_width;
  iVar11 = this->m_viewportW;
  dVar5 = deRandom_getUint32(&local_40);
  uVar14 = dVar5 % ((iVar7 - iVar11) + 1U);
  pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar7 = pRVar8->m_height;
  iVar11 = this->m_viewportH;
  dVar5 = deRandom_getUint32(&local_40);
  y = dVar5 % ((iVar7 - iVar11) + 1U);
  tcu::Surface::Surface(&local_320,this->m_viewportW,this->m_viewportH);
  tcu::Surface::Surface(&local_338,this->m_viewportH,this->m_viewportH);
  TVar2 = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pBVar16 = (this->m_paramSets).
            super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
            ._M_impl.super__Vector_impl_data._M_start + this->m_curParamSetNdx;
  rr::FragmentOperationState::FragmentOperationState(&local_e0);
  poVar1 = (ostringstream *)(local_260 + 8);
  local_260._0_8_ = TVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"RGB equation = ",0xf);
  pcVar9 = glu::getBlendEquationName(pBVar16->equationRGB);
  iVar7 = (int)poVar1;
  if (pcVar9 == (char *)0x0) {
    std::ios::clear(iVar7 + (int)*(undefined8 *)(local_260._8_8_ + -0x18));
  }
  else {
    sVar10 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar9,sVar10);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_260 + 0x78));
  local_260._0_8_ = TVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"RGB src func = ",0xf);
  pcVar9 = glu::getBlendFactorName(pBVar16->srcFuncRGB);
  if (pcVar9 == (char *)0x0) {
    std::ios::clear(iVar7 + (int)*(undefined8 *)(local_260._8_8_ + -0x18));
  }
  else {
    sVar10 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar9,sVar10);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_260 + 0x78));
  local_260._0_8_ = TVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"RGB dst func = ",0xf);
  pcVar9 = glu::getBlendFactorName(pBVar16->dstFuncRGB);
  if (pcVar9 == (char *)0x0) {
    std::ios::clear(iVar7 + (int)*(undefined8 *)(local_260._8_8_ + -0x18));
  }
  else {
    sVar10 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar9,sVar10);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_260 + 0x78));
  local_260._0_8_ = TVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Alpha equation = ",0x11);
  pcVar9 = glu::getBlendEquationName(pBVar16->equationAlpha);
  if (pcVar9 == (char *)0x0) {
    std::ios::clear(iVar7 + (int)*(undefined8 *)(local_260._8_8_ + -0x18));
  }
  else {
    sVar10 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar9,sVar10);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_260 + 0x78));
  local_260._0_8_ = TVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Alpha src func = ",0x11);
  pcVar9 = glu::getBlendFactorName(pBVar16->srcFuncAlpha);
  if (pcVar9 == (char *)0x0) {
    std::ios::clear(iVar7 + (int)*(undefined8 *)(local_260._8_8_ + -0x18));
  }
  else {
    sVar10 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar9,sVar10);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_260 + 0x78));
  local_260._0_8_ = TVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Alpha dst func = ",0x11);
  pcVar9 = glu::getBlendFactorName(pBVar16->dstFuncAlpha);
  if (pcVar9 == (char *)0x0) {
    std::ios::clear(iVar7 + (int)*(undefined8 *)(local_260._8_8_ + -0x18));
  }
  else {
    sVar10 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar9,sVar10);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_260 + 0x78));
  poVar1 = (ostringstream *)(local_260 + 8);
  local_260._0_8_ = TVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Blend color = (",0xf);
  std::ostream::_M_insert<double>((double)(pBVar16->blendColor).m_data[0]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<double>((double)(pBVar16->blendColor).m_data[1]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<double>((double)(pBVar16->blendColor).m_data[2]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<double>((double)(pBVar16->blendColor).m_data[3]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_260 + 0x78));
  glwBlendEquationSeparate(pBVar16->equationRGB,pBVar16->equationAlpha);
  GVar6 = glwGetError();
  glu::checkError(GVar6,"glBlendEquationSeparate(paramSet.equationRGB, paramSet.equationAlpha)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fBlendTests.cpp"
                  ,0xe7);
  glwBlendFuncSeparate
            (pBVar16->srcFuncRGB,pBVar16->dstFuncRGB,pBVar16->srcFuncAlpha,pBVar16->dstFuncAlpha);
  GVar6 = glwGetError();
  glu::checkError(GVar6,
                  "glBlendFuncSeparate(paramSet.srcFuncRGB, paramSet.dstFuncRGB, paramSet.srcFuncAlpha, paramSet.dstFuncAlpha)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fBlendTests.cpp"
                  ,0xe8);
  glwBlendColor((pBVar16->blendColor).m_data[0],(pBVar16->blendColor).m_data[1],
                (pBVar16->blendColor).m_data[2],(pBVar16->blendColor).m_data[3]);
  GVar6 = glwGetError();
  glu::checkError(GVar6,
                  "glBlendColor(paramSet.blendColor.x(), paramSet.blendColor.y(), paramSet.blendColor.z(), paramSet.blendColor.w())"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fBlendTests.cpp"
                  ,0xe9);
  local_e0.blendRGBState.equation = sglr::rr_util::mapGLBlendEquation(pBVar16->equationRGB);
  local_e0.blendRGBState.srcFunc = sglr::rr_util::mapGLBlendFunc(pBVar16->srcFuncRGB);
  local_e0.blendRGBState.dstFunc = sglr::rr_util::mapGLBlendFunc(pBVar16->dstFuncRGB);
  local_e0.blendAState.equation = sglr::rr_util::mapGLBlendEquation(pBVar16->equationAlpha);
  local_e0.blendAState.srcFunc = sglr::rr_util::mapGLBlendFunc(pBVar16->srcFuncAlpha);
  local_e0.blendAState.dstFunc = sglr::rr_util::mapGLBlendFunc(pBVar16->dstFuncAlpha);
  local_e0.blendColor.m_data._0_8_ = *(undefined8 *)(pBVar16->blendColor).m_data;
  local_e0.blendColor.m_data._8_8_ = *(undefined8 *)((pBVar16->blendColor).m_data + 2);
  glwDisable(0xbe2);
  glwViewport(uVar14,y,this->m_viewportW,this->m_viewportH);
  deqp::gls::FragmentOpUtil::QuadRenderer::render(this->m_renderer,&this->m_firstQuad);
  glwEnable(0xbe2);
  deqp::gls::FragmentOpUtil::QuadRenderer::render(this->m_renderer,&this->m_secondQuad);
  glwFlush();
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess((ConstPixelBufferAccess *)local_260);
  local_e0.blendMode = BLENDMODE_NONE;
  pRVar3 = this->m_referenceRenderer;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_308,this->m_refColorBuffer);
  deqp::gls::FragmentOpUtil::getMultisampleAccess
            ((PixelBufferAccess *)&local_2d8,(PixelBufferAccess *)&local_308);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
            (pRVar3,(PixelBufferAccess *)&local_2d8,(PixelBufferAccess *)local_260,
             (PixelBufferAccess *)local_260,&this->m_firstQuadInt,&local_e0);
  local_e0.blendMode = BLENDMODE_STANDARD;
  pRVar3 = this->m_referenceRenderer;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_308,this->m_refColorBuffer);
  deqp::gls::FragmentOpUtil::getMultisampleAccess
            ((PixelBufferAccess *)&local_2d8,(PixelBufferAccess *)&local_308);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
            (pRVar3,(PixelBufferAccess *)&local_2d8,(PixelBufferAccess *)local_260,
             (PixelBufferAccess *)local_260,&this->m_secondQuadInt,&local_e0);
  local_308.m_format.order = RGBA;
  local_308.m_format.type = UNORM_INT8;
  pvVar15 = (void *)local_338.m_pixels.m_cap;
  if ((void *)local_338.m_pixels.m_cap != (void *)0x0) {
    pvVar15 = local_338.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_2d8,&local_308.m_format,local_338.m_width,
             local_338.m_height,1,pvVar15);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_308,this->m_refColorBuffer);
  tcu::copy((EVP_PKEY_CTX *)&local_2d8,(EVP_PKEY_CTX *)&local_308);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_308.m_format.order = RGBA;
  local_308.m_format.type = UNORM_INT8;
  pvVar15 = (void *)local_320.m_pixels.m_cap;
  if ((void *)local_320.m_pixels.m_cap != (void *)0x0) {
    pvVar15 = local_320.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_2d8,&local_308.m_format,local_320.m_width,
             local_320.m_height,1,pvVar15);
  glu::readPixels(context,uVar14,y,(PixelBufferAccess *)&local_2d8);
  pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar7 = (pRVar8->m_pixelFormat).alphaBits;
  local_28c = 0;
  if (0 < iVar7) {
    local_28c = 0x1000000 << (8U - (char)iVar7 & 0x1f);
  }
  local_28c = 0x100 << (8U - (char)(pRVar8->m_pixelFormat).greenBits & 0x1f) |
              1 << ((byte)(8 - (char)(pRVar8->m_pixelFormat).redBits) & 0x1f) |
              0x10000 << (8U - (char)(pRVar8->m_pixelFormat).blueBits & 0x1f) | local_28c;
  tcu::RGBA::toIVec((RGBA *)&local_2a8);
  local_308.m_format.type = local_2a8.type * 5;
  local_308.m_format.order = local_2a8.order * 5;
  local_308.m_size.m_data[0] = iStack_2a0 * 5;
  local_308.m_size.m_data[1] = iStack_29c * 5;
  local_288[0] = 2;
  local_288[1] = 2;
  local_288[2] = 2;
  local_288[3] = 2;
  local_2d8.m_format.order = R;
  local_2d8.m_format.type = SNORM_INT8;
  local_2d8.m_size.m_data[0] = 0;
  local_2d8.m_size.m_data[1] = 0;
  lVar12 = 0;
  do {
    local_2d8.m_size.m_data[lVar12 + -2] =
         (uint)local_308.m_size.m_data[lVar12 + -2] / local_288[lVar12];
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  local_278.m_data[0] = local_2d8.m_format.order + L;
  local_278.m_data[1] = local_2d8.m_format.type + UNORM_INT8;
  local_278.m_data[2] = local_2d8.m_size.m_data[0] + 3;
  local_278.m_data[3] = local_2d8.m_size.m_data[1] + 3;
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_308.m_format.order = RGBA;
  local_308.m_format.type = UNORM_INT8;
  if ((void *)local_338.m_pixels.m_cap != (void *)0x0) {
    local_338.m_pixels.m_cap = (size_t)local_338.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_2d8,&local_308.m_format,local_338.m_width,
             local_338.m_height,1,(void *)local_338.m_pixels.m_cap);
  local_2a8.order = RGBA;
  local_2a8.type = UNORM_INT8;
  if ((void *)local_320.m_pixels.m_cap != (void *)0x0) {
    local_320.m_pixels.m_cap = (size_t)local_320.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_308,&local_2a8,local_320.m_width,local_320.m_height,1,
             (void *)local_320.m_pixels.m_cap);
  bVar4 = tcu::intThresholdCompare
                    (log,"CompareResult","Image Comparison Result",&local_2d8,&local_308,&local_278,
                     COMPARE_LOG_RESULT);
  if (bVar4) {
    iVar7 = this->m_curParamSetNdx + 1;
    this->m_curParamSetNdx = iVar7;
    iVar11 = (int)((ulong)((long)(this->m_paramSets).
                                 super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_paramSets).
                                super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
    IVar13 = CONTINUE;
    if (SBORROW4(iVar7,iVar11 * -0x33333333) != iVar7 + iVar11 * 0x33333333 < 0) goto LAB_0036b943;
    pcVar9 = "Passed";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    pcVar9 = "Image compare failed";
    testResult = QP_TEST_RESULT_FAIL;
  }
  IVar13 = STOP;
  tcu::TestContext::setTestResult(((this->super_TestCase).m_context)->m_testCtx,testResult,pcVar9);
LAB_0036b943:
  tcu::Surface::~Surface(&local_338);
  tcu::Surface::~Surface(&local_320);
  return IVar13;
}

Assistant:

BlendCase::IterateResult BlendCase::iterate (void)
{
	de::Random						rnd				(deStringHash(getName()) ^ deInt32Hash(m_curParamSetNdx));
	int								viewportX		= rnd.getInt(0, m_context.getRenderTarget().getWidth() - m_viewportW);
	int								viewportY		= rnd.getInt(0, m_context.getRenderTarget().getHeight() - m_viewportH);
	tcu::Surface					renderedImg		(m_viewportW, m_viewportH);
	tcu::Surface					referenceImg	(m_viewportH, m_viewportH);
	TestLog&						log				(m_testCtx.getLog());
	const BlendParams&				paramSet		= m_paramSets[m_curParamSetNdx];
	rr::FragmentOperationState		referenceState;

	// Log the blend parameters.

	log << TestLog::Message << "RGB equation = " << getBlendEquationName(paramSet.equationRGB) << TestLog::EndMessage;
	log << TestLog::Message << "RGB src func = " << getBlendFactorName(paramSet.srcFuncRGB) << TestLog::EndMessage;
	log << TestLog::Message << "RGB dst func = " << getBlendFactorName(paramSet.dstFuncRGB) << TestLog::EndMessage;
	log << TestLog::Message << "Alpha equation = " << getBlendEquationName(paramSet.equationAlpha) << TestLog::EndMessage;
	log << TestLog::Message << "Alpha src func = " << getBlendFactorName(paramSet.srcFuncAlpha) << TestLog::EndMessage;
	log << TestLog::Message << "Alpha dst func = " << getBlendFactorName(paramSet.dstFuncAlpha) << TestLog::EndMessage;
	log << TestLog::Message << "Blend color = (" << paramSet.blendColor.x() << ", " << paramSet.blendColor.y() << ", " << paramSet.blendColor.z() << ", " << paramSet.blendColor.w() << ")" << TestLog::EndMessage;

	// Set GL state.

	GLU_CHECK_CALL(glBlendEquationSeparate(paramSet.equationRGB, paramSet.equationAlpha));
	GLU_CHECK_CALL(glBlendFuncSeparate(paramSet.srcFuncRGB, paramSet.dstFuncRGB, paramSet.srcFuncAlpha, paramSet.dstFuncAlpha));
	GLU_CHECK_CALL(glBlendColor(paramSet.blendColor.x(), paramSet.blendColor.y(), paramSet.blendColor.z(), paramSet.blendColor.w()));

	// Set reference state.

	referenceState.blendRGBState.equation	= sglr::rr_util::mapGLBlendEquation(paramSet.equationRGB);
	referenceState.blendRGBState.srcFunc	= sglr::rr_util::mapGLBlendFunc(paramSet.srcFuncRGB);
	referenceState.blendRGBState.dstFunc	= sglr::rr_util::mapGLBlendFunc(paramSet.dstFuncRGB);
	referenceState.blendAState.equation		= sglr::rr_util::mapGLBlendEquation(paramSet.equationAlpha);
	referenceState.blendAState.srcFunc		= sglr::rr_util::mapGLBlendFunc(paramSet.srcFuncAlpha);
	referenceState.blendAState.dstFunc		= sglr::rr_util::mapGLBlendFunc(paramSet.dstFuncAlpha);
	referenceState.blendColor				= paramSet.blendColor;

	// Render with GL.

	glDisable(GL_BLEND);
	glViewport(viewportX, viewportY, m_viewportW, m_viewportH);
	m_renderer->render(m_firstQuad);
	glEnable(GL_BLEND);
	m_renderer->render(m_secondQuad);
	glFlush();

	// Render reference.

	const tcu::PixelBufferAccess nullAccess = tcu::PixelBufferAccess();

	referenceState.blendMode = rr::BLENDMODE_NONE;
	m_referenceRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()), nullAccess /* no depth */, nullAccess /* no stencil */, m_firstQuadInt, referenceState);
	referenceState.blendMode = rr::BLENDMODE_STANDARD;
	m_referenceRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()), nullAccess /* no depth */, nullAccess /* no stencil */, m_secondQuadInt, referenceState);

	// Expand reference color buffer to RGBA8
	copy(referenceImg.getAccess(), m_refColorBuffer->getAccess());

	// Read GL image.

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedImg.getAccess());

	// Compare images.

	UVec4 compareThreshold = m_context.getRenderTarget().getPixelFormat().getColorThreshold().toIVec().asUint()
							 * UVec4(5) / UVec4(2) + UVec4(3); // \note Non-scientific ad hoc formula. Need big threshold when few color bits; blending brings extra inaccuracy.

	bool comparePass = tcu::intThresholdCompare(m_testCtx.getLog(), "CompareResult", "Image Comparison Result", referenceImg.getAccess(), renderedImg.getAccess(), compareThreshold, tcu::COMPARE_LOG_RESULT);

	// Fail now if images don't match.

	if (!comparePass)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Image compare failed");
		return STOP;
	}

	// Continue if param sets still remain in m_paramSets; otherwise stop.

	m_curParamSetNdx++;

	if (m_curParamSetNdx < (int)m_paramSets.size())
		return CONTINUE;
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Passed");
		return STOP;
	}
}